

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WeekData.cpp
# Opt level: O0

void __thiscall WeekData::parseRequirements(WeekData *this,json *j_arg)

{
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  vector<DayRequirement_*,_std::allocator<DayRequirement_*>_> *this_01;
  unordered_map<std::__cxx11::string,std::vector<DayRequirement*,std::allocator<DayRequirement*>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<DayRequirement*,std::allocator<DayRequirement*>>>>>
  *puVar1;
  bool bVar2;
  const_reference other;
  reference other_00;
  reference pvVar3;
  pointer ppVar4;
  Scenario *this_02;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>_>
  *this_03;
  pointer ppVar5;
  string *psVar6;
  pointer ppVar7;
  const_reference __rhs;
  DayRequirement *this_04;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_unordered_map<basic_string<char>,_vector<DayRequirement_*>_>_>_&&>::value,_pair<iterator,_bool>_>
  _Var8;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_vector<DayRequirement_*>_>_&&>::value,_pair<iterator,_bool>_>
  _Var9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_440;
  int local_3b0;
  int local_3ac;
  DayRequirement *local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  undefined1 local_380 [8];
  json js;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>,_true>
  _Stack_368;
  int i;
  vector<DayRequirement_*,_std::allocator<DayRequirement_*>_> *local_360;
  vector<DayRequirement_*,_std::allocator<DayRequirement_*>_> *days;
  undefined1 local_350;
  vector<DayRequirement_*,_std::allocator<DayRequirement_*>_> local_348;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>
  local_330;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>,_true>
  local_2f8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>,_true>
  local_2f0;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>
  local_2e8;
  ShiftType *local_2e0;
  ShiftType *currentShiftType;
  unordered_map<std::__cxx11::string,std::vector<DayRequirement*,std::allocator<DayRequirement*>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<DayRequirement*,std::allocator<DayRequirement*>>>>>
  *local_2d0;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>
  *shifts;
  undefined1 local_2c0;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>
  local_2b8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>
  local_280;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>,_true>
  local_228;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>,_true>
  local_220;
  undefined1 local_218 [8];
  string shiftType_str;
  string skill;
  json requirement_json;
  iterator __end1;
  iterator __begin1;
  json *__range1;
  undefined1 local_178;
  allocator local_177;
  allocator local_176;
  allocator local_175;
  allocator local_174;
  allocator local_173;
  allocator local_172;
  allocator local_171;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  iterator local_88;
  size_type local_80;
  undefined1 local_78 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  DaysOfTheWeekVector;
  allocator local_49;
  undefined1 local_48 [8];
  string requirementTxt;
  json requirements_json;
  json *j_arg_local;
  WeekData *this_local;
  
  other = nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
          ::operator[]<char_const>
                    ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                      *)j_arg,"requirements");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)((long)&requirementTxt.field_2 + 8),other);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_48,"requirementOn",&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  local_178 = 1;
  local_170 = &local_168;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_168,"Monday",&local_171);
  local_170 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_148,"Tuesday",&local_172);
  local_170 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_128,"Wednesday",&local_173);
  local_170 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"Thursday",&local_174);
  local_170 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"Friday",&local_175);
  local_170 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"Saturday",&local_176);
  local_170 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"Sunday",&local_177);
  local_178 = 0;
  local_88 = &local_168;
  local_80 = 7;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&__range1 + 7));
  __l._M_len = local_80;
  __l._M_array = local_88;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_78,__l,
           (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)((long)&__range1 + 7));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&__range1 + 7));
  local_440 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88;
  do {
    local_440 = local_440 + -1;
    std::__cxx11::string::~string((string *)local_440);
  } while (local_440 != &local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_177);
  std::allocator<char>::~allocator((allocator<char> *)&local_176);
  std::allocator<char>::~allocator((allocator<char> *)&local_175);
  std::allocator<char>::~allocator((allocator<char> *)&local_174);
  std::allocator<char>::~allocator((allocator<char> *)&local_173);
  std::allocator<char>::~allocator((allocator<char> *)&local_172);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  this_00 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             *)((long)&requirementTxt.field_2 + 8);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::begin((iterator *)&__end1.m_it.primitive_iterator,this_00);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::end((iterator *)&requirement_json.m_value,this_00);
  while (bVar2 = nlohmann::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 ::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 ::operator!=((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                               *)&__end1.m_it.primitive_iterator,
                              (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                               *)&requirement_json.m_value), bVar2) {
    other_00 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::
               iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
               ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                            *)&__end1.m_it.primitive_iterator);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)((long)&skill.field_2 + 8),other_00);
    pvVar3 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)(skill.field_2._M_local_buf + 8),"skill");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&shiftType_str.field_2 + 8),pvVar3);
    pvVar3 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)(skill.field_2._M_local_buf + 8),"shiftType");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218,pvVar3
              );
    local_220._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>_>_>
         ::find(&this->requirements,(key_type *)((long)&shiftType_str.field_2 + 8));
    local_228._M_cur =
         (__node_type *)
         std::
         end<std::unordered_map<std::__cxx11::string,std::unordered_map<std::__cxx11::string,std::vector<DayRequirement*,std::allocator<DayRequirement*>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<DayRequirement*,std::allocator<DayRequirement*>>>>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unordered_map<std::__cxx11::string,std::vector<DayRequirement*,std::allocator<DayRequirement*>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<DayRequirement*,std::allocator<DayRequirement*>>>>>>>>>
                   (&this->requirements);
    bVar2 = std::__detail::operator==(&local_220,&local_228);
    if (bVar2) {
      local_2b8._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      local_2b8._M_h._M_rehash_policy._4_4_ = 0;
      local_2b8._M_h._M_rehash_policy._M_next_resize = 0;
      local_2b8._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_2b8._M_h._M_element_count = 0;
      local_2b8._M_h._M_buckets = (__buckets_ptr)0x0;
      local_2b8._M_h._M_bucket_count = 0;
      local_2b8._M_h._M_single_bucket = (__node_base_ptr)0x0;
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>
      ::unordered_map(&local_2b8);
      std::
      make_pair<std::__cxx11::string_const&,std::unordered_map<std::__cxx11::string,std::vector<DayRequirement*,std::allocator<DayRequirement*>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<DayRequirement*,std::allocator<DayRequirement*>>>>>>
                (&local_280,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&shiftType_str.field_2 + 8),&local_2b8);
      _Var8 = std::
              unordered_map<std::__cxx11::string,std::unordered_map<std::__cxx11::string,std::vector<DayRequirement*,std::allocator<DayRequirement*>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<DayRequirement*,std::allocator<DayRequirement*>>>>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unordered_map<std::__cxx11::string,std::vector<DayRequirement*,std::allocator<DayRequirement*>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<DayRequirement*,std::allocator<DayRequirement*>>>>>>>>
              ::
              insert<std::pair<std::__cxx11::string,std::unordered_map<std::__cxx11::string,std::vector<DayRequirement*,std::allocator<DayRequirement*>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<DayRequirement*,std::allocator<DayRequirement*>>>>>>>
                        ((unordered_map<std::__cxx11::string,std::unordered_map<std::__cxx11::string,std::vector<DayRequirement*,std::allocator<DayRequirement*>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<DayRequirement*,std::allocator<DayRequirement*>>>>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unordered_map<std::__cxx11::string,std::vector<DayRequirement*,std::allocator<DayRequirement*>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<DayRequirement*,std::allocator<DayRequirement*>>>>>>>>
                          *)&this->requirements,&local_280);
      shifts = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>
                *)_Var8.first.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>,_true>
                  ._M_cur;
      local_2c0 = _Var8.second;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>
      ::~pair(&local_280);
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>
      ::~unordered_map(&local_2b8);
    }
    currentShiftType =
         (ShiftType *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>_>_>
         ::find(&this->requirements,(key_type *)((long)&shiftType_str.field_2 + 8));
    ppVar4 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>,_false,_true>
                           *)&currentShiftType);
    local_2d0 = (unordered_map<std::__cxx11::string,std::vector<DayRequirement*,std::allocator<DayRequirement*>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<DayRequirement*,std::allocator<DayRequirement*>>>>>
                 *)&ppVar4->second;
    this_02 = Scenario::getInstance();
    this_03 = Scenario::getShifts_abi_cxx11_(this_02);
    local_2e8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>_>
         ::find(this_03,(key_type *)local_218);
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>
             ::operator->(&local_2e8);
    puVar1 = local_2d0;
    local_2e0 = &ppVar5->second;
    psVar6 = ShiftType::getId_abi_cxx11_(local_2e0);
    local_2f0._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>
         ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>
                 *)puVar1,psVar6);
    local_2f8._M_cur =
         (__node_type *)
         std::
         end<std::unordered_map<std::__cxx11::string,std::vector<DayRequirement*,std::allocator<DayRequirement*>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<DayRequirement*,std::allocator<DayRequirement*>>>>>>
                   ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>
                     *)local_2d0);
    bVar2 = std::__detail::operator==(&local_2f0,&local_2f8);
    puVar1 = local_2d0;
    if (bVar2) {
      psVar6 = ShiftType::getId_abi_cxx11_(local_2e0);
      local_348.super__Vector_base<DayRequirement_*,_std::allocator<DayRequirement_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_348.super__Vector_base<DayRequirement_*,_std::allocator<DayRequirement_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_348.super__Vector_base<DayRequirement_*,_std::allocator<DayRequirement_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>::vector(&local_348);
      std::
      make_pair<std::__cxx11::string_const&,std::vector<DayRequirement*,std::allocator<DayRequirement*>>>
                (&local_330,psVar6,&local_348);
      _Var9 = std::
              unordered_map<std::__cxx11::string,std::vector<DayRequirement*,std::allocator<DayRequirement*>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<DayRequirement*,std::allocator<DayRequirement*>>>>>
              ::
              insert<std::pair<std::__cxx11::string,std::vector<DayRequirement*,std::allocator<DayRequirement*>>>>
                        (puVar1,&local_330);
      days = (vector<DayRequirement_*,_std::allocator<DayRequirement_*>_> *)
             _Var9.first.
             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>,_true>
             ._M_cur;
      local_350 = _Var9.second;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>
      ::~pair(&local_330);
      std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>::~vector(&local_348);
    }
    puVar1 = local_2d0;
    psVar6 = ShiftType::getId_abi_cxx11_(local_2e0);
    _Stack_368._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>
         ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>
                 *)puVar1,psVar6);
    ppVar7 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>,_false,_true>
                           *)&stack0xfffffffffffffc98);
    local_360 = &ppVar7->second;
    for (js.m_value.number_integer._4_4_ = 0; (int)js.m_value.number_integer._4_4_ < 7;
        js.m_value.number_integer._4_4_ = js.m_value.number_integer._4_4_ + 1) {
      __rhs = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_78,(long)(int)js.m_value.number_integer._4_4_);
      std::operator+(&local_3a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                     __rhs);
      pvVar3 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                             *)((long)&skill.field_2 + 8),&local_3a0);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)local_380,pvVar3);
      std::__cxx11::string::~string((string *)&local_3a0);
      this_01 = local_360;
      this_04 = (DayRequirement *)operator_new(8);
      pvVar3 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)local_380,"minimum");
      local_3ac = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  ::operator_int<int,_0>(pvVar3);
      pvVar3 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)local_380,"optimal");
      local_3b0 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  ::operator_int<int,_0>(pvVar3);
      DayRequirement::DayRequirement(this_04,&local_3ac,&local_3b0);
      local_3a8 = this_04;
      std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>::push_back
                (this_01,&local_3a8);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)local_380);
    }
    std::__cxx11::string::~string((string *)local_218);
    std::__cxx11::string::~string((string *)(shiftType_str.field_2._M_local_buf + 8));
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)((long)&skill.field_2 + 8));
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::operator++((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                  *)&__end1.m_it.primitive_iterator);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_78);
  std::__cxx11::string::~string((string *)local_48);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)((long)&requirementTxt.field_2 + 8));
  return;
}

Assistant:

void WeekData::parseRequirements(const json &j_arg) {
    json requirements_json = j_arg["requirements"];

    string requirementTxt = "requirementOn";

    const vector<string> DaysOfTheWeekVector {"Monday", "Tuesday", "Wednesday", "Thursday", "Friday", "Saturday", "Sunday"};

    for (json requirement_json : requirements_json) {

        const string skill = requirement_json["skill"];
        const string shiftType_str = requirement_json["shiftType"];

        if (requirements.find(skill) == end(requirements))
            requirements.insert(
                make_pair(
                        skill,
                        unordered_map<string, vector<DayRequirement*>>()
                ));

        unordered_map<string, vector<DayRequirement*>> &shifts = requirements.find(skill)->second;
        ShiftType &currentShiftType = Scenario::getInstance()->getShifts().find(shiftType_str)->second;

        if (shifts.find(currentShiftType.getId()) == end(shifts))
            shifts.insert(
                    make_pair(
                            currentShiftType.getId(),
                            vector<DayRequirement*>()
                    ));

        vector<DayRequirement*> &days = shifts.find(currentShiftType.getId())->second;

        for (int i = 0; i < NUMBER_DAYS_OF_THE_WEEK; i++) {
            json js = requirement_json[requirementTxt + DaysOfTheWeekVector.at(i)];

            days.push_back(new DayRequirement(js["minimum"], js["optimal"]));
        }
    }
}